

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer_unittest.cc
# Opt level: O3

void __thiscall
google::protobuf::anon_unknown_0::ComparisonTest_SandwichTest_Test::
~ComparisonTest_SandwichTest_Test(ComparisonTest_SandwichTest_Test *this)

{
  ComparisonTest::~ComparisonTest(&this->super_ComparisonTest);
  operator_delete(this,0x1118);
  return;
}

Assistant:

TEST_F(ComparisonTest, SandwichTest) {
  proto1_.clear_optional_int64();
  proto1_.clear_optional_uint32();

  proto2_.clear_optional_uint64();

  EXPECT_EQ(
      "added: optional_int64: 102\n"
      "added: optional_uint32: 103\n"
      "deleted: optional_uint64: 104\n",
      Run());
}